

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O2

void __thiscall wallet::CWalletTx::Unserialize<DataStream>(CWalletTx *this,DataStream *s)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  __index_type _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  iterator iVar7;
  long lVar8;
  uint32_t uVar9;
  uchar uVar10;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  bool dummy_bool;
  vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_> dummy_vector2;
  vector<uint256,_std::allocator<uint256>_> dummy_vector1;
  undefined8 local_98;
  undefined7 uStack_90;
  uchar uStack_89;
  undefined7 uStack_88;
  uchar auStack_81 [9];
  uint256 serialized_block_hash;
  key_type local_58;
  uint32_t local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  Init(this);
  dummy_vector1.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dummy_vector1.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dummy_vector1.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dummy_vector2.super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dummy_vector2.super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dummy_vector2.super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  uVar9 = 0x6fd8c9;
  local_58._M_dataplus._M_p._0_1_ = 0xc9;
  local_58._M_dataplus._M_p._1_7_ = 0x6fd8;
  local_58._M_string_length._0_1_ = (uchar)&this->tx;
  local_58._M_string_length._1_7_ = (undefined7)((ulong)&this->tx >> 8);
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>::Unserialize<DataStream>
            ((ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)&local_58,
             s);
  base_blob<256U>::Unserialize<DataStream>(&serialized_block_hash.super_base_blob<256U>,s);
  Unserialize<DataStream,uint256,std::allocator<uint256>>(s,&dummy_vector1);
  uVar4 = ser_readdata32<DataStream>(s);
  Unserialize<DataStream,wallet::CMerkleTx,std::allocator<wallet::CMerkleTx>>(s,&dummy_vector2);
  Unserialize<DataStream,std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            (s,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this);
  Unserialize<DataStream,std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            (s,&this->vOrderForm);
  uVar5 = ser_readdata32<DataStream>(s);
  this->fTimeReceivedIsTxTime = uVar5;
  uVar5 = ser_readdata32<DataStream>(s);
  this->nTimeReceived = uVar5;
  ::Unserialize<DataStream>(s,&this->fFromMe);
  ::Unserialize<DataStream>(s,&dummy_bool);
  local_58.field_2._M_local_buf[0] =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  local_58.field_2._M_allocated_capacity._1_7_ =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems._17_7_;
  local_58.field_2._M_local_buf[8] =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  local_58.field_2._M_local_buf[9] =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  local_58.field_2._M_local_buf[10] =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_58.field_2._M_local_buf[0xb] =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_58.field_2._M_local_buf[0xc] =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_58.field_2._M_local_buf[0xd] =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_58.field_2._M_local_buf[0xe] =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_58.field_2._M_local_buf[0xf] =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_58._M_dataplus._M_p._0_1_ = serialized_block_hash.super_base_blob<256U>.m_data._M_elems[0];
  local_58._M_dataplus._M_p._1_7_ =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems._1_7_;
  local_58._M_string_length._0_1_ = serialized_block_hash.super_base_blob<256U>.m_data._M_elems[8];
  local_58._M_string_length._1_7_ =
       serialized_block_hash.super_base_blob<256U>.m_data._M_elems._9_7_;
  local_38 = uVar4;
  bVar2 = ::operator==((base_blob<256U> *)&local_58,&uint256::ZERO.super_base_blob<256U>);
  if (bVar2) {
    _Var3 = '\x04';
    uVar4 = local_38;
    if (local_38 == 0) {
      uVar10 = '\0';
LAB_0049d225:
      _Var3 = '\x03';
      uVar4 = local_38;
      goto LAB_0049d25f;
    }
  }
  else {
    bVar2 = ::operator==((base_blob<256U> *)&local_58,&uint256::ONE.super_base_blob<256U>);
    uVar4 = local_38;
    uVar9 = local_38;
    if (bVar2) {
      _Var3 = '\x04';
      if (local_38 == 0xffffffff) {
        uVar10 = '\x01';
        goto LAB_0049d225;
      }
    }
    else if ((int)local_38 < 0) {
      _Var3 = (local_38 != 0xffffffff) * '\x02' + '\x02';
    }
    else {
      _Var3 = '\0';
      uVar4 = 0xffffffff;
    }
  }
  local_98 = CONCAT17((uchar)local_58._M_string_length,local_58._M_dataplus._M_p._1_7_);
  uStack_90 = local_58._M_string_length._1_7_;
  uStack_89 = local_58.field_2._M_local_buf[0];
  uStack_88 = local_58.field_2._M_allocated_capacity._1_7_;
  auStack_81[0] = local_58.field_2._M_local_buf[8];
  auStack_81[1] = local_58.field_2._M_local_buf[9];
  auStack_81[2] = local_58.field_2._M_local_buf[10];
  auStack_81[3] = local_58.field_2._M_local_buf[0xb];
  auStack_81[4] = local_58.field_2._M_local_buf[0xc];
  auStack_81[5] = local_58.field_2._M_local_buf[0xd];
  auStack_81[6] = local_58.field_2._M_local_buf[0xe];
  auStack_81[7] = local_58.field_2._M_local_buf[0xf];
  uVar10 = (uchar)local_58._M_dataplus._M_p;
LAB_0049d25f:
  *(uchar *)&(this->m_state).
             super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             .
             super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             .
             super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             .
             super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             .
             super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
             .
             super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
       = uVar10;
  *(undefined8 *)
   ((long)&(this->m_state).
           super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
   + 1) = local_98;
  *(ulong *)((long)&(this->m_state).
                    super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
            + 9) = CONCAT17(uStack_89,uStack_90);
  *(ulong *)((long)&(this->m_state).
                    super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                    .
                    super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
            + 0x10) = CONCAT71(uStack_88,uStack_89);
  *(undefined8 *)
   ((long)&(this->m_state).
           super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
   + 0x18) = auStack_81._0_8_;
  *(uint32_t *)
   ((long)&(this->m_state).
           super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
   + 0x20) = uVar4;
  *(uint32_t *)
   ((long)&(this->m_state).
           super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
   + 0x24) = uVar9;
  *(__index_type *)
   ((long)&(this->m_state).
           super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
           .
           super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
   + 0x28) = _Var3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"n",(allocator<char> *)&local_98);
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  p_Var1 = &(this->mapValue)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar7._M_node == p_Var1) {
    lVar8 = -1;
  }
  else {
    str._M_str = *(char **)(iVar7._M_node + 2);
    str._M_len = (size_t)iVar7._M_node[2]._M_parent;
    lVar8 = LocaleIndependentAtoi<long>(str);
  }
  this->nOrderPos = lVar8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"timesmart",(allocator<char> *)&local_98);
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if ((_Rb_tree_header *)iVar7._M_node == p_Var1) {
    uVar6 = 0;
  }
  else {
    str_00._M_str = *(char **)(iVar7._M_node + 2);
    str_00._M_len = (size_t)iVar7._M_node[2]._M_parent;
    lVar8 = LocaleIndependentAtoi<long>(str_00);
    uVar6 = (uint)lVar8;
  }
  this->nTimeSmart = uVar6;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"fromaccount",(allocator<char> *)&local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"spent",(allocator<char> *)&local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"n",(allocator<char> *)&local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"timesmart",(allocator<char> *)&local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::_Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>::~_Vector_base
            (&dummy_vector2.
              super__Vector_base<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&dummy_vector1.super__Vector_base<uint256,_std::allocator<uint256>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        Init();

        std::vector<uint256> dummy_vector1; //!< Used to be vMerkleBranch
        std::vector<CMerkleTx> dummy_vector2; //!< Used to be vtxPrev
        bool dummy_bool; //! Used to be fSpent
        uint256 serialized_block_hash;
        int serializedIndex;
        s >> TX_WITH_WITNESS(tx) >> serialized_block_hash >> dummy_vector1 >> serializedIndex >> dummy_vector2 >> mapValue >> vOrderForm >> fTimeReceivedIsTxTime >> nTimeReceived >> fFromMe >> dummy_bool;

        m_state = TxStateInterpretSerialized({serialized_block_hash, serializedIndex});

        const auto it_op = mapValue.find("n");
        nOrderPos = (it_op != mapValue.end()) ? LocaleIndependentAtoi<int64_t>(it_op->second) : -1;
        const auto it_ts = mapValue.find("timesmart");
        nTimeSmart = (it_ts != mapValue.end()) ? static_cast<unsigned int>(LocaleIndependentAtoi<int64_t>(it_ts->second)) : 0;

        mapValue.erase("fromaccount");
        mapValue.erase("spent");
        mapValue.erase("n");
        mapValue.erase("timesmart");
    }